

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O3

void __thiscall
amrex::DistributionMapping::KnapSackDoIt
          (DistributionMapping *this,vector<long,_std::allocator<long>_> *wgts,int param_2,
          Real *efficiency,bool do_full_knapsack,int nmax,bool sort)

{
  ostringstream *poVar1;
  int *piVar2;
  pointer piVar3;
  pointer piVar4;
  char cVar5;
  undefined1 auVar6 [16];
  pointer ppVar7;
  int iVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  size_type __n;
  size_type sVar14;
  pointer pvVar15;
  uint uVar16;
  pointer ppVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  undefined1 auVar22 [16];
  int iVar24;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> LIpairV;
  Vector<int,_std::allocator<int>_> ord;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vec;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  wrkerord;
  char local_251;
  ulong local_250;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> local_248;
  undefined1 local_228 [16];
  pointer local_218;
  pointer local_210;
  undefined1 local_208 [16];
  pointer local_1f8;
  Real *local_1f0;
  vector<long,_std::allocator<long>_> *local_1e8;
  DistributionMapping *local_1e0;
  undefined1 local_1d8 [16];
  pointer local_1c8;
  Print local_1b8;
  undefined1 auVar23 [16];
  
  local_1f0 = efficiency;
  local_1e8 = wgts;
  local_1e0 = this;
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    local_1b8.os = OutStream();
    poVar1 = &local_1b8.ss;
    local_1b8.comm = *(undefined4 *)(DAT_00816950 + -0x48);
    local_1b8.rank = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DM: KnapSackDoIt called...",0x1a);
    std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    Print::~Print(&local_1b8);
  }
  uVar10 = *(uint *)(DAT_00816950 + -0x38);
  local_250 = (ulong)uVar10;
  local_1f8 = (pointer)0x0;
  local_208 = (undefined1  [16])0x0;
  *local_1f0 = 0.0;
  knapsack(local_1e8,uVar10,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_208,local_1f0,do_full_knapsack,nmax);
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    uVar10 = (int)((long)(local_208._8_8_ - local_208._0_8_) >> 3) * -0x55555555;
    if (0 < (int)uVar10) {
      poVar1 = &local_1b8.ss;
      pvVar15 = (pointer)0x0;
      do {
        local_1b8.os = OutStream();
        local_1b8.comm = *(undefined4 *)(DAT_00816950 + -0x48);
        local_1b8.rank = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  Bucket ",9);
        std::ostream::operator<<(poVar1,(int)pvVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," contains boxes:",0x10);
        cVar5 = (char)poVar1;
        std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        Print::~Print(&local_1b8);
        uVar16 = (uint)((ulong)((long)(((pointer)(local_208._0_8_ + pvVar15 * 0x18))->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(((pointer)(local_208._0_8_ + pvVar15 * 0x18))->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start) >> 2);
        local_210 = pvVar15;
        if (0 < (int)uVar16) {
          uVar13 = 0;
          do {
            local_1b8.os = OutStream();
            local_1b8.comm = *(undefined4 *)(DAT_00816950 + -0x48);
            local_1b8.rank = *(undefined4 *)(DAT_00816950 + -0x30);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                 *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"    ",4);
            std::ostream::operator<<
                      (poVar1,(((pointer)(local_208._0_8_ + pvVar15 * 0x18))->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[uVar13]);
            std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            Print::~Print(&local_1b8);
            uVar13 = uVar13 + 1;
          } while ((uVar16 & 0x7fffffff) != uVar13);
        }
        pvVar15 = (pointer)((long)&(local_210->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + 1);
      } while (pvVar15 != (pointer)(ulong)(uVar10 & 0x7fffffff));
    }
  }
  __n = (size_type)(int)local_250;
  local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pair<long,_int> *)0x0;
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::reserve(&local_248,__n)
  ;
  if (0 < (int)local_250) {
    uVar13 = 0;
    do {
      piVar9 = (((pointer)(local_208._0_8_ + uVar13 * 0x18))->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      piVar2 = (((pointer)(local_208._0_8_ + uVar13 * 0x18))->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
      if (piVar9 == piVar2) {
        local_1b8._0_8_ = 0;
      }
      else {
        local_1b8._0_8_ = 0;
        do {
          local_1b8._0_8_ =
               local_1b8._0_8_ +
               (local_1e8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start[*piVar9];
          piVar9 = piVar9 + 1;
        } while (piVar9 != piVar2);
      }
      local_1b8.os = (ostream *)CONCAT44(local_1b8.os._4_4_,(int)uVar13);
      if (local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>::
        _M_realloc_insert<std::pair<long,int>>
                  ((vector<std::pair<long,int>,std::allocator<std::pair<long,int>>> *)&local_248,
                   (iterator)
                   local_248.
                   super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(pair<long,_int> *)&local_1b8);
      }
      else {
        (local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_finish)->first = local_1b8._0_8_;
        *(ostream **)
         &(local_248.
           super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->second = local_1b8.os;
        local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_248.
             super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_250);
  }
  if (sort) {
    Sort(&local_248,true);
  }
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    ppVar7 = local_248.
             super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      poVar1 = &local_1b8.ss;
      ppVar17 = local_248.
                super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        local_1b8.os = OutStream();
        local_1b8.comm = *(undefined4 *)(DAT_00816950 + -0x48);
        local_1b8.rank = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  Bucket ",9);
        std::ostream::operator<<(poVar1,ppVar17->second);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," total weight: ",0xf);
        std::ostream::_M_insert<long>((long)poVar1);
        std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        Print::~Print(&local_1b8);
        ppVar17 = ppVar17 + 1;
      } while (ppVar17 != ppVar7);
    }
  }
  local_228 = (undefined1  [16])0x0;
  local_218 = (pointer)0x0;
  local_1c8 = (pointer)0x0;
  local_1d8 = (undefined1  [16])0x0;
  if (sort) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_228,__n);
    auVar6 = _DAT_0074fb40;
    if ((int)local_250 < 1) goto LAB_00524ec2;
    lVar11 = local_250 - 1;
    auVar18._8_4_ = (int)lVar11;
    auVar18._0_8_ = lVar11;
    auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar13 = 0;
    auVar18 = auVar18 ^ _DAT_0074fb40;
    auVar20 = _DAT_0074fb30;
    do {
      auVar22 = auVar20 ^ auVar6;
      if ((bool)(~(auVar22._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar22._0_4_ ||
                  auVar18._4_4_ < auVar22._4_4_) & 1)) {
        *(int *)(local_228._0_8_ + uVar13 * 4) = (int)uVar13;
      }
      if ((auVar22._12_4_ != auVar18._12_4_ || auVar22._8_4_ <= auVar18._8_4_) &&
          auVar22._12_4_ <= auVar18._12_4_) {
        *(int *)(local_228._0_8_ + (uVar13 + 1) * 4) = (int)uVar13 + 1;
      }
      uVar13 = uVar13 + 2;
      lVar11 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar11 + 2;
    } while (((int)local_250 + 1U & 0xfffffffe) != uVar13);
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_228,__n);
    auVar18 = _DAT_007568b0;
    auVar20 = _DAT_0074fb40;
    auVar6 = _DAT_0074fb30;
    if (local_228._0_8_ != local_228._8_8_) {
      uVar13 = local_228._8_8_ + (-4 - local_228._0_8_);
      auVar22._8_4_ = (int)uVar13;
      auVar22._0_8_ = uVar13;
      auVar22._12_4_ = (int)(uVar13 >> 0x20);
      auVar19._0_8_ = uVar13 >> 2;
      auVar19._8_8_ = auVar22._8_8_ >> 2;
      uVar12 = 0;
      auVar19 = auVar19 ^ _DAT_0074fb40;
      do {
        iVar21 = (int)uVar12;
        auVar23._8_4_ = iVar21;
        auVar23._0_8_ = uVar12;
        auVar23._12_4_ = (int)(uVar12 >> 0x20);
        auVar22 = (auVar23 | auVar6) ^ auVar20;
        iVar8 = auVar19._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar8 && auVar19._0_4_ < auVar22._0_4_ ||
                    iVar8 < auVar22._4_4_) & 1)) {
          *(int *)(local_228._0_8_ + uVar12 * 4) = iVar21;
        }
        if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
            auVar22._12_4_ <= auVar19._12_4_) {
          *(int *)(local_228._0_8_ + (uVar12 + 1) * 4) = iVar21 + 1;
        }
        auVar22 = (auVar23 | auVar18) ^ auVar20;
        iVar24 = auVar22._4_4_;
        if (iVar24 <= iVar8 && (iVar24 != iVar8 || auVar22._0_4_ <= auVar19._0_4_)) {
          *(int *)(local_228._0_8_ + (uVar12 + 2) * 4) = iVar21 + 2;
          *(int *)(local_228._0_8_ + (uVar12 + 3) * 4) = iVar21 + 3;
        }
        uVar12 = uVar12 + 4;
      } while (((uVar13 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
    }
  }
  if (0 < (int)local_250) {
    sVar14 = 0;
    do {
      iVar8 = local_248.
              super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar14].second;
      iVar21 = *(int *)(local_228._0_8_ + sVar14 * 4);
      piVar3 = (((pointer)(local_208._0_8_ + (long)iVar8 * 0x18))->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
      local_210 = (pointer)local_208._0_8_;
      piVar4 = (((pointer)(local_208._0_8_ + (long)iVar8 * 0x18))->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
        local_1b8.os = OutStream();
        poVar1 = &local_1b8.ss;
        local_1b8.comm = *(undefined4 *)(DAT_00816950 + -0x48);
        local_1b8.rank = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"  Mapping bucket ",0x11);
        std::ostream::operator<<(poVar1,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," to rank ",9);
        std::ostream::operator<<(poVar1,iVar21);
        std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        Print::~Print(&local_1b8);
      }
      uVar10 = (uint)((ulong)((long)piVar3 - (long)piVar4) >> 2);
      if (0 < (int)uVar10) {
        pvVar15 = local_210 + iVar8;
        uVar13 = 0;
        do {
          iVar8 = ParallelContext::Frame::local_to_global_rank
                            ((Frame *)(DAT_00816950 + -0x48),iVar21);
          *(int *)(*(long *)&(((local_1e0->m_ref).
                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                  (long)(pvVar15->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar13] * 4) = iVar8;
          uVar13 = uVar13 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar13);
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != __n);
  }
LAB_00524ec2:
  if (verbose != 0) {
    local_1b8.os = OutStream();
    poVar1 = &local_1b8.ss;
    local_1b8.comm = *(undefined4 *)(DAT_00816950 + -0x48);
    local_1b8.rank = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"KNAPSACK efficiency: ",0x15);
    std::ostream::_M_insert<double>(*local_1f0);
    local_251 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_251,1);
    Print::~Print(&local_1b8);
  }
  std::
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
             *)local_1d8);
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,(long)local_218 - local_228._0_8_);
  }
  if (local_248.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.
                    super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.
                          super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.
                          super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_208);
  return;
}

Assistant:

void
DistributionMapping::KnapSackDoIt (const std::vector<Long>& wgts,
                                   int                    /*  nprocs */,
                                   Real&                    efficiency,
                                   bool                     do_full_knapsack,
                                   int                      nmax,
                                   bool                     sort)
{
    if (flag_verbose_mapper) {
        Print() << "DM: KnapSackDoIt called..." << std::endl;
    }

    BL_PROFILE("DistributionMapping::KnapSackDoIt()");

    int nprocs = ParallelContext::NProcsSub();

    // If team is not use, we are going to treat it as a special case in which
    // the number of teams is nprocs and the number of workers is 1.

    int nteams = nprocs;
    int nworkers = 1;
#if defined(BL_USE_TEAM)
    nteams = ParallelDescriptor::NTeams();
    nworkers = ParallelDescriptor::TeamSize();
#endif

    std::vector< std::vector<int> > vec;

    efficiency = 0;

    knapsack(wgts,nteams,vec,efficiency,do_full_knapsack,nmax);

    if (flag_verbose_mapper) {
        for (int i = 0, ni = vec.size(); i < ni; ++i) {
            Print() << "  Bucket " << i << " contains boxes:" << std::endl;
            for (int j = 0, nj = vec[i].size(); j < nj; ++j) {
                Print() << "    " << vec[i][j] << std::endl;
            }
        }
    }

    BL_ASSERT(static_cast<int>(vec.size()) == nteams);

    std::vector<LIpair> LIpairV;

    LIpairV.reserve(nteams);

    for (int i = 0; i < nteams; ++i)
    {
        Long wgt = 0;
        for (std::vector<int>::const_iterator lit = vec[i].begin(), End = vec[i].end();
             lit != End; ++lit)
        {
            wgt += wgts[*lit];
        }

        LIpairV.push_back(LIpair(wgt,i));
    }

    if (sort) {Sort(LIpairV, true);}

    if (flag_verbose_mapper) {
        for (const auto &p : LIpairV) {
            Print() << "  Bucket " << p.second << " total weight: " << p.first << std::endl;
        }
    }

    Vector<int> ord;
    Vector<Vector<int> > wrkerord;

    if (nteams == nprocs) {
        if (sort) {
            LeastUsedCPUs(nprocs,ord);
        } else {
            ord.resize(nprocs);
            std::iota(ord.begin(), ord.end(), 0);
        }
    } else {
        if (sort) {
            LeastUsedTeams(ord,wrkerord,nteams,nworkers);
        } else {
            ord.resize(nteams);
            std::iota(ord.begin(), ord.end(), 0);
            wrkerord.resize(nteams);
            for (auto& v : wrkerord) {
                v.resize(nworkers);
                std::iota(v.begin(), v.end(), 0);
            }
        }
    }

    for (int i = 0; i < nteams; ++i)
    {
        const int idx = LIpairV[i].second;
        const int tid = ord[i];

        const std::vector<int>& vi = vec[idx];
        const int N = vi.size();

        if (flag_verbose_mapper) {
            Print() << "  Mapping bucket " << idx << " to rank " << tid << std::endl;
        }

        if (nteams == nprocs) {
            for (int j = 0; j < N; ++j)
            {
                m_ref->m_pmap[vi[j]] = ParallelContext::local_to_global_rank(tid);
            }
        } else {
#ifdef BL_USE_TEAM
            int leadrank = tid * nworkers;
            for (int w = 0; w < nworkers; ++w)
            {
                ParallelDescriptor::team_for(0, N, w, [&] (int j) {
                        m_ref->m_pmap[vi[j]] = leadrank + wrkerord[i][w];
                    });
            }
#endif
        }
    }

    if (verbose)
    {
        amrex::Print() << "KNAPSACK efficiency: " << efficiency << '\n';
    }

}